

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathRandom.h
# Opt level: O1

Vec3<float> __thiscall
Imath_3_2::hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>(Imath_3_2 *this,Rand48 *rand)

{
  uint i;
  long lVar1;
  float fVar2;
  double dVar3;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Vec3<float> VVar7;
  Vec3<float> v;
  Vec3<float> local_30;
  
  lVar1 = 0;
  do {
    do {
      do {
        dVar3 = (double)Imath_3_2::erand48(rand->_state);
        (&local_30.x)[lVar1] = (float)(dVar3 - (1.0 - dVar3));
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      uVar4 = 0;
      fVar2 = local_30.z * local_30.z + local_30.x * local_30.x + local_30.y * local_30.y;
      if (fVar2 < 2.3509887e-38) {
        fVar2 = Vec3<float>::lengthTiny(&local_30);
        uVar4 = extraout_XMM0_Db_00;
      }
      else if (fVar2 < 0.0) {
        fVar2 = sqrtf(fVar2);
        uVar4 = extraout_XMM0_Db;
      }
      else {
        fVar2 = SQRT(fVar2);
      }
      lVar1 = 0;
    } while (1.0 < fVar2);
    lVar1 = 0;
  } while ((fVar2 == 0.0) && (!NAN(fVar2)));
  VVar7.z = local_30.z / fVar2;
  auVar5._4_4_ = local_30.y;
  auVar5._0_4_ = local_30.x;
  auVar5._8_8_ = 0;
  auVar6._4_4_ = fVar2;
  auVar6._0_4_ = fVar2;
  auVar6._8_4_ = uVar4;
  auVar6._12_4_ = uVar4;
  auVar6 = divps(auVar5,auVar6);
  *(long *)this = auVar6._0_8_;
  *(float *)(this + 8) = VVar7.z;
  VVar7.y = fVar2;
  VVar7.x = fVar2;
  return VVar7;
}

Assistant:

IMATH_HOSTDEVICE Vec
hollowSphereRand (Rand& rand)
{
    Vec                    v;
    typename Vec::BaseType length;

    do
    {
        for (unsigned int i = 0; i < Vec::dimensions (); i++)
            v[i] = (typename Vec::BaseType) rand.nextf (-1, 1);

        length = v.length ();
    } while (length > 1 || length == 0);

    return v / length;
}